

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Container<google::protobuf::UnknownFieldSet> *
google::protobuf::Arena::
Create<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
          (Arena *arena)

{
  Arena *arena_local;
  _func_void_void_ptr *destructor;
  Container<google::protobuf::UnknownFieldSet> *local_10;
  
  if (arena == (Arena *)0x0) {
    local_10 = (Container<google::protobuf::UnknownFieldSet> *)operator_new(0x20);
    (local_10->unknown_fields).fields_.
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_10->unknown_fields).fields_.
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_10->super_ContainerBase).arena = (Arena *)0x0;
    (local_10->unknown_fields).fields_.
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>::Container(local_10);
  }
  else {
    local_10 = (Container<google::protobuf::UnknownFieldSet> *)
               AllocateInternal(arena,0x20,8,
                                internal::
                                arena_destruct_object<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                                ,(type_info *)
                                 &internal::InternalMetadata::
                                  Container<google::protobuf::UnknownFieldSet>::typeinfo);
    memset(local_10,0,0x20);
    internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>::Container(local_10);
  }
  return local_10;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* Create(Arena* arena, Args&&... args) {
    return CreateInternal<T>(arena, std::is_convertible<T*, MessageLite*>(),
                             static_cast<Args&&>(args)...);
  }